

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void anon_unknown.dwarf_c9fea::StateTestBPMINT(BinaryPolynomialModel<int,_double> *bpm)

{
  PolynomialValueList<double> *poly_value;
  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  _Var1;
  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  _Var2;
  bool bVar3;
  pointer *__ptr;
  char *pcVar4;
  char *in_R9;
  double dVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<int> __l_11;
  initializer_list<int> __l_12;
  initializer_list<int> __l_13;
  initializer_list<int> __l_14;
  initializer_list<int> __l_15;
  initializer_list<int> __l_16;
  initializer_list<int> __l_17;
  initializer_list<int> __l_18;
  initializer_list<int> __l_19;
  initializer_list<int> __l_20;
  initializer_list<int> __l_21;
  initializer_list<int> __l_22;
  initializer_list<int> __l_23;
  initializer_list<int> __l_24;
  initializer_list<int> __l_25;
  initializer_list<int> __l_26;
  initializer_list<int> __l_27;
  initializer_list<int> __l_28;
  initializer_list<int> __l_29;
  initializer_list<int> __l_30;
  initializer_list<int> __l_31;
  initializer_list<int> __l_32;
  initializer_list<int> __l_33;
  initializer_list<int> __l_34;
  initializer_list<int> __l_35;
  initializer_list<int> __l_36;
  AssertionResult gtest_ar_22;
  AssertHelper local_88;
  allocator_type local_79;
  AssertionResult gtest_ar_4;
  vector<int,_std::allocator<int>_> sorted_variables;
  int local_34;
  
  gtest_ar_4._0_8_ = (bpm->variables_)._M_h._M_element_count;
  gtest_ar_22._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&sorted_variables,"bpm.GetNumVariables()","4",(unsigned_long *)&gtest_ar_4,
             (int *)&gtest_ar_22);
  if ((char)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x152,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetOffset(bpm);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&sorted_variables,"bpm.GetOffset()","0.0",dVar5,0.0);
  if ((char)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x154,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_ar_4._0_8_ =
       ((long)(bpm->poly_key_list_).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(bpm->poly_key_list_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  gtest_ar_22._0_4_ = 0xf;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&sorted_variables,"bpm.GetNumInteractions()","15",
             (unsigned_long *)&gtest_ar_4,(int *)&gtest_ar_22);
  if ((char)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x156,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_ar_4._0_8_ = cimod::BinaryPolynomialModel<int,_double>::GetDegree(bpm);
  gtest_ar_22._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&sorted_variables,"bpm.GetDegree()","4",(unsigned_long *)&gtest_ar_4,
             (int *)&gtest_ar_22);
  if ((char)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x158,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_ar_22._0_4_ = 0xffffffff;
  __l._M_len = 1;
  __l._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-1} )","1.0",dVar5,1.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15b,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22._0_4_ = 0xfffffffe;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_00,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-2} )","2.0",dVar5,2.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15c,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22._0_4_ = 0xfffffffd;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_01,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-3} )","3.0",dVar5,3.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15d,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22._0_4_ = 0xfffffffc;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_02,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-4} )","4.0",dVar5,4.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15e,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xffffffffffffff;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_03,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-2, -1} )","12.0",dVar5,12.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15f,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xffffffffffffff;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_04,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-3, -1} )","13.0",dVar5,13.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x160,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xffffffffffffff;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_05,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-4, -1} )","14.0",dVar5,14.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x161,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffeffffff;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_06,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-3, -2} )","23.0",dVar5,23.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x162,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffeffffff;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_07,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-4, -2} )","24.0",dVar5,24.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x163,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffdffffff;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_08,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-4, -3} )","34.0",dVar5,34.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x164,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffeffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xffffffff;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_09,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-3, -2, -1} )","123.0",dVar5,123.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x165,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffeffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xffffffff;
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_10,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-4, -2, -1} )","124.0",dVar5,124.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x166,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffdffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xffffffff;
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_11,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-4, -3, -1} )","134.0",dVar5,134.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x167,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffdffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xfffffffe;
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_12,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-4, -3, -2} )","234.0",dVar5,234.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x168,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffdffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xfffffffffffffffe;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector
            (&sorted_variables,__l_13,(allocator_type *)&local_88);
  dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-4, -3, -2, -1})","1234.0",dVar5,1234.0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x169,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  if (bpm->vartype_ == BINARY) {
    gtest_ar_22.success_ = true;
    gtest_ar_22._1_7_ = 0xffffffffffffff;
    gtest_ar_22.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0xffffffffffffffff;
    __l_15._M_len = 4;
    __l_15._M_array = (iterator)&gtest_ar_22;
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_variables,__l_15,(allocator_type *)&local_88);
    dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-1, -1, -1, -1} )","1.0",dVar5,1.0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&sorted_variables);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x173,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
      if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_4.message_);
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_7_ = 0xffffffffffffff;
    gtest_ar_4.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0xfffffffeffffffff;
    __l_17._M_len = 5;
    __l_17._M_array = (iterator)&gtest_ar_4;
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_variables,__l_17,(allocator_type *)&local_88);
    dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_22,"bpm.GetPolynomial({-1, -1, -1, -2, -2} )","12.0",dVar5,12.0
              );
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
    if (gtest_ar_22.success_ == false) {
      testing::Message::Message((Message *)&sorted_variables);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_22.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_22.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x174,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_4,(Message *)&sorted_variables);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_22.message_);
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_7_ = 0xfffffffdffffff;
    gtest_ar_4.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0xfffffffdfffffffd;
    __l_19._M_len = 5;
    __l_19._M_array = (iterator)&gtest_ar_4;
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_variables,__l_19,(allocator_type *)&local_88);
    dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_22,"bpm.GetPolynomial({-1, -3, -3, -3, -1} )","13.0",dVar5,13.0
              );
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
    if (gtest_ar_22.success_ == false) {
      testing::Message::Message((Message *)&sorted_variables);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_22.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_22.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x175,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_4,(Message *)&sorted_variables);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_22.message_);
    sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0xfffffffd;
    stack0xffffffffffffffbc = 0xfffffffefffffffe;
    sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xfffffffefffffffd;
    sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = 0xfffffffd;
    sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ = 0xfffffffe;
    __l_21._M_len = 7;
    __l_21._M_array = (iterator)&sorted_variables;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&gtest_ar_4,__l_21,(allocator_type *)&local_88);
    dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                      (bpm,(vector<int,_std::allocator<int>_> *)&gtest_ar_4);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_22,"bpm.GetPolynomial({-3, -2, -3, -2, -3, -2, -2})","23.0",
               dVar5,23.0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&gtest_ar_4);
    if (gtest_ar_22.success_ == false) {
      testing::Message::Message((Message *)&sorted_variables);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_22.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_22.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x176,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_4,(Message *)&sorted_variables);
LAB_0011b7bb:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
      if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  else {
    if (bpm->vartype_ != SPIN) goto LAB_0011b7df;
    gtest_ar_22.success_ = true;
    gtest_ar_22._1_7_ = 0xffffffffffffff;
    gtest_ar_22.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0xffffffff;
    __l_14._M_len = 3;
    __l_14._M_array = (iterator)&gtest_ar_22;
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_variables,__l_14,(allocator_type *)&local_88);
    dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-1, -1, -1} )","1.0",dVar5,1.0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&sorted_variables);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x16d,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
      if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_4.message_);
    gtest_ar_22.success_ = true;
    gtest_ar_22._1_7_ = 0xffffffffffffff;
    gtest_ar_22.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0xfffffffeffffffff;
    __l_16._M_len = 4;
    __l_16._M_array = (iterator)&gtest_ar_22;
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_variables,__l_16,(allocator_type *)&local_88);
    dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-1, -1, -1, -2} )","12.0",dVar5,12.0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&sorted_variables);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x16e,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
      if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_4.message_);
    gtest_ar_22.success_ = true;
    gtest_ar_22._1_7_ = 0xfffffffdffffff;
    gtest_ar_22.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0xfffffffdfffffffd;
    __l_18._M_len = 4;
    __l_18._M_array = (iterator)&gtest_ar_22;
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_variables,__l_18,(allocator_type *)&local_88);
    dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_4,"bpm.GetPolynomial({-1, -3, -3, -3} )","13.0",dVar5,13.0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&sorted_variables);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x16f,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
      if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_4.message_);
    gtest_ar_4.success_ = true;
    gtest_ar_4._1_7_ = 0xfffffffeffffff;
    gtest_ar_4.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0xfffffffefffffffd;
    __l_20._M_len = 6;
    __l_20._M_array = (iterator)&gtest_ar_4;
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_variables,__l_20,(allocator_type *)&local_88);
    dVar5 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial(bpm,&sorted_variables);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar_22,"bpm.GetPolynomial({-3, -2, -3, -2, -3, -2})","23.0",dVar5,
               23.0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
    if (gtest_ar_22.success_ == false) {
      testing::Message::Message((Message *)&sorted_variables);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_22.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_22.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x170,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_4,(Message *)&sorted_variables);
      goto LAB_0011b7bb;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_22.message_);
LAB_0011b7df:
  gtest_ar_22._0_4_ = 0xfffffffc;
  gtest_ar_4._0_8_ =
       cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers(bpm,(int *)&gtest_ar_22);
  local_88.data_ = (AssertHelperData *)((ulong)local_88.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&sorted_variables,"bpm.GetVariablesToIntegers(-4)","0",(long *)&gtest_ar_4,
             (int *)&local_88);
  if ((char)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x17a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_ar_22._0_4_ = 0xfffffffd;
  gtest_ar_4._0_8_ =
       cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers(bpm,(int *)&gtest_ar_22);
  local_88.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&sorted_variables,"bpm.GetVariablesToIntegers(-3)","1",(long *)&gtest_ar_4,
             (int *)&local_88);
  if ((char)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x17b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_ar_22._0_4_ = 0xfffffffe;
  gtest_ar_4._0_8_ =
       cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers(bpm,(int *)&gtest_ar_22);
  local_88.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&sorted_variables,"bpm.GetVariablesToIntegers(-2)","2",(long *)&gtest_ar_4,
             (int *)&local_88);
  if ((char)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x17c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  gtest_ar_22._0_4_ = 0xffffffff;
  gtest_ar_4._0_8_ =
       cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers(bpm,(int *)&gtest_ar_22);
  local_88.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&sorted_variables,"bpm.GetVariablesToIntegers(-1)","3",(long *)&gtest_ar_4,
             (int *)&local_88);
  if ((char)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if ((undefined8 *)
        CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT44(sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  sorted_variables.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x17d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (gtest_ar_4._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_4._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_._0_4_ = 0xffffffff;
  __l_22._M_len = 1;
  __l_22._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_22,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-1} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x180,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_._0_4_ = 0xfffffffe;
  __l_23._M_len = 1;
  __l_23._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_23,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-2} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x181,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_._0_4_ = 0xfffffffd;
  __l_24._M_len = 1;
  __l_24._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_24,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x182,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_._0_4_ = 0xfffffffc;
  __l_25._M_len = 1;
  __l_25._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_25,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x183,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_ = (AssertHelperData *)0xfffffffffffffffe;
  __l_26._M_len = 2;
  __l_26._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_26,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-2, -1} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x184,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_ = (AssertHelperData *)0xfffffffffffffffd;
  __l_27._M_len = 2;
  __l_27._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_27,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -1} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x185,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_ = (AssertHelperData *)0xfffffffffffffffc;
  __l_28._M_len = 2;
  __l_28._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_28,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -1} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x186,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_ = (AssertHelperData *)0xfffffffefffffffd;
  __l_29._M_len = 2;
  __l_29._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_29,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -2} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x187,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_ = (AssertHelperData *)0xfffffffefffffffc;
  __l_30._M_len = 2;
  __l_30._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_30,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -2} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x188,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.data_ = (AssertHelperData *)0xfffffffdfffffffc;
  __l_31._M_len = 2;
  __l_31._M_array = (iterator)&local_88;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_31,&local_79);
  gtest_ar_22._0_8_ =
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3} )"
             ,"1",(long *)&gtest_ar_22,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x189,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffeffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xffffffff;
  __l_32._M_len = 3;
  __l_32._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_32,&local_79);
  local_88.data_ =
       (AssertHelperData *)
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -2, -1} )"
             ,"1",(long *)&local_88,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18a,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffeffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xffffffff;
  __l_33._M_len = 3;
  __l_33._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_33,&local_79);
  local_88.data_ =
       (AssertHelperData *)
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -2, -1} )"
             ,"1",(long *)&local_88,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18b,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffdffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xffffffff;
  __l_34._M_len = 3;
  __l_34._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_34,&local_79);
  local_88.data_ =
       (AssertHelperData *)
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -1} )"
             ,"1",(long *)&local_88,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18c,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffdffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xfffffffe;
  __l_35._M_len = 3;
  __l_35._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_35,&local_79);
  local_88.data_ =
       (AssertHelperData *)
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -2} )"
             ,"1",(long *)&local_88,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18d,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  _Var1._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  gtest_ar_22.success_ = true;
  gtest_ar_22._1_7_ = 0xfffffffdffffff;
  gtest_ar_22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xfffffffffffffffe;
  __l_36._M_len = 4;
  __l_36._M_array = (iterator)&gtest_ar_22;
  std::vector<int,_std::allocator<int>_>::vector(&sorted_variables,__l_36,&local_79);
  local_88.data_ =
       (AssertHelperData *)
       std::
       __count_if<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>>
                 (_Var1,_Var2,&sorted_variables);
  local_34 = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_4,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -2, -1})"
             ,"1",(long *)&local_88,&local_34);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&sorted_variables);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18e,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_22,(Message *)&sorted_variables);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22);
    if (sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  poly_value = &bpm->poly_value_list_;
  bVar3 = EXPECT_CONTAIN(1.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_4.success_ = bVar3;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(1.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x191,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(2.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(2.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x192,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(3.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(3.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x193,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(4.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(4.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x194,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(12.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(12.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x195,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(13.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(13.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x196,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(14.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(14.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x197,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(23.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(23.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x198,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(24.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(24.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x199,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(34.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(34.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19a,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(123.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(123.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19b,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(124.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(124.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19c,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(134.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(134.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19d,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(234.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(234.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19e,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_4.success_ = EXPECT_CONTAIN(1234.0,poly_value);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_4.success_) {
    testing::Message::Message((Message *)&gtest_ar_22);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sorted_variables,(internal *)&gtest_ar_4,
               (AssertionResult *)"EXPECT_CONTAIN(1234.0, bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19f,(char *)sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&sorted_variables);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  cimod::BinaryPolynomialModel<int,_double>::GetSortedVariables(&sorted_variables,bpm);
  gtest_ar_22._0_4_ = 0xfffffffc;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_4,"sorted_variables[0]","-4",
             sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,(int *)&gtest_ar_22);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_22);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22._0_4_ = 0xfffffffd;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_4,"sorted_variables[1]","-3",
             sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 1,(int *)&gtest_ar_22);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_22);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22._0_4_ = 0xfffffffe;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_4,"sorted_variables[2]","-2",
             sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 2,(int *)&gtest_ar_22);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_22);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  gtest_ar_22._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_4,"sorted_variables[3]","-1",
             sorted_variables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 3,(int *)&gtest_ar_22);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_22);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  local_88.data_._0_4_ = 0xffffffff;
  gtest_ar_22._0_8_ =
       std::
       _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::count((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)bpm,(key_type_conflict *)&local_88);
  local_34 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"bpm.GetVariables().count(-1)","1",
             (unsigned_long *)&gtest_ar_22,&local_34);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_22);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  local_88.data_._0_4_ = 0xfffffffe;
  gtest_ar_22._0_8_ =
       std::
       _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::count((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)bpm,(key_type_conflict *)&local_88);
  local_34 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"bpm.GetVariables().count(-2)","1",
             (unsigned_long *)&gtest_ar_22,&local_34);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_22);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1aa,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  local_88.data_._0_4_ = 0xfffffffd;
  gtest_ar_22._0_8_ =
       std::
       _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::count((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)bpm,(key_type_conflict *)&local_88);
  local_34 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"bpm.GetVariables().count(-3)","1",
             (unsigned_long *)&gtest_ar_22,&local_34);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_22);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1ab,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  local_88.data_._0_4_ = 0xfffffffc;
  gtest_ar_22._0_8_ =
       std::
       _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::count((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)bpm,(key_type_conflict *)&local_88);
  local_34 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_4,"bpm.GetVariables().count(-4)","1",
             (unsigned_long *)&gtest_ar_22,&local_34);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_22);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1ac,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_22);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (gtest_ar_22._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_22._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_4.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sorted_variables.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void StateTestBPMINT(const BinaryPolynomialModel<int32_t, double> &bpm) {
   
   EXPECT_EQ(bpm.GetNumVariables(), 4);

   EXPECT_DOUBLE_EQ(bpm.GetOffset(), 0.0);
   
   EXPECT_EQ(bpm.GetNumInteractions(), 15);
   
   EXPECT_EQ(bpm.GetDegree(), 4);
      
   //Polynomial
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1}            ), 1.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-2}            ), 2.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3}            ), 3.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4}            ), 4.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-2, -1}        ), 12.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -1}        ), 13.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -1}        ), 14.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -2}        ), 23.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -2}        ), 24.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -3}        ), 34.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -2, -1}    ), 123.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -2, -1}    ), 124.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -3, -1}    ), 134.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -3, -2}    ), 234.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -3, -2, -1}), 1234.0);
   
   //Polynomial duplicate key
   if (bpm.GetVartype() == cimod::Vartype::SPIN) {
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -1, -1}            ), 1.0 );
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -1, -1, -2}        ), 12.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -3, -3, -3}        ), 13.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -2, -3, -2, -3, -2}), 23.0);
   }
   else if (bpm.GetVartype() == cimod::Vartype::BINARY) {
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -1, -1, -1}            ), 1.0 );
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -1, -1, -2, -2}        ), 12.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -3, -3, -3, -1}        ), 13.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -2, -3, -2, -3, -2, -2}), 23.0);
   }
   
   //variables_to_integers
   EXPECT_EQ(bpm.GetVariablesToIntegers(-4), 0);
   EXPECT_EQ(bpm.GetVariablesToIntegers(-3), 1);
   EXPECT_EQ(bpm.GetVariablesToIntegers(-2), 2);
   EXPECT_EQ(bpm.GetVariablesToIntegers(-1), 3);
   
   //Polynomial Key
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-1}            ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-2}            ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3}            ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4}            ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-2, -1}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -1}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -1}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -2}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -2}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -2, -1}    ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -2, -1}    ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -1}    ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -2}    ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -2, -1}), 1);

   //Polynomial Val
   EXPECT_TRUE(EXPECT_CONTAIN(1.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(2.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(3.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(4.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(12.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(13.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(14.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(23.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(24.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(34.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(123.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(124.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(134.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(234.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(1234.0, bpm.GetValueList()));

   //sorted_variables
   auto sorted_variables = bpm.GetSortedVariables();
   EXPECT_EQ(sorted_variables[0], -4);
   EXPECT_EQ(sorted_variables[1], -3);
   EXPECT_EQ(sorted_variables[2], -2);
   EXPECT_EQ(sorted_variables[3], -1);
   
   //variables
   EXPECT_EQ(bpm.GetVariables().count(-1), 1);
   EXPECT_EQ(bpm.GetVariables().count(-2), 1);
   EXPECT_EQ(bpm.GetVariables().count(-3), 1);
   EXPECT_EQ(bpm.GetVariables().count(-4), 1);
}